

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

off64_t zng_gzseek(gzFile file,off64_t offset,int whence)

{
  int32_t iVar1;
  uint uVar2;
  __off64_t _Var3;
  int in_EDX;
  long in_RSI;
  gz_state *in_RDI;
  gz_state *state;
  off64_t ret;
  uint n;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  gz_state *state_00;
  long local_8;
  
  if (in_RDI == (gz_state *)0x0) {
    local_8 = -1;
  }
  else if ((in_RDI->mode == 0x1c4f) || (in_RDI->mode == 0x79b1)) {
    if ((in_RDI->err == 0) || (in_RDI->err == -5)) {
      if ((in_EDX == 0) || (in_EDX == 1)) {
        if (in_EDX == 0) {
          in_RSI = in_RSI - (in_RDI->x).pos;
        }
        else if (in_RDI->seek != 0) {
          in_RSI = in_RDI->skip + in_RSI;
        }
        in_RDI->seek = 0;
        if (((in_RDI->mode == 0x1c4f) && (in_RDI->how == 1)) && (-1 < (in_RDI->x).pos + in_RSI)) {
          state_00 = in_RDI;
          _Var3 = lseek64(in_RDI->fd,in_RSI - (ulong)(in_RDI->x).have,1);
          if (_Var3 == -1) {
            local_8 = -1;
          }
          else {
            (in_RDI->x).have = 0;
            in_RDI->eof = 0;
            in_RDI->past = 0;
            in_RDI->seek = 0;
            gz_error(state_00,(int)((ulong)in_RSI >> 0x20),
                     (char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
            (in_RDI->strm).avail_in = 0;
            (in_RDI->x).pos = in_RSI + (in_RDI->x).pos;
            local_8 = (in_RDI->x).pos;
          }
        }
        else {
          if (in_RSI < 0) {
            if (in_RDI->mode != 0x1c4f) {
              return -1;
            }
            in_RSI = (in_RDI->x).pos + in_RSI;
            if (in_RSI < 0) {
              return -1;
            }
            iVar1 = zng_gzrewind((gzFile)CONCAT44(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8));
            if (iVar1 == -1) {
              return -1;
            }
          }
          if (in_RDI->mode == 0x1c4f) {
            if (in_RSI < (long)(ulong)(in_RDI->x).have) {
              uVar2 = (uint)in_RSI;
            }
            else {
              uVar2 = (in_RDI->x).have;
            }
            (in_RDI->x).have = (in_RDI->x).have - uVar2;
            (in_RDI->x).next = (in_RDI->x).next + uVar2;
            (in_RDI->x).pos = (ulong)uVar2 + (in_RDI->x).pos;
            in_RSI = in_RSI - (ulong)uVar2;
          }
          if (in_RSI != 0) {
            in_RDI->seek = 1;
            in_RDI->skip = in_RSI;
          }
          local_8 = (in_RDI->x).pos + in_RSI;
        }
      }
      else {
        local_8 = -1;
      }
    }
    else {
      local_8 = -1;
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

z_off64_t Z_EXPORT PREFIX4(gzseek)(gzFile file, z_off64_t offset, int whence) {
    unsigned n;
    z_off64_t ret;
    gz_state *state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_state *)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* check that there's no error */
    if (state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;

    /* can only seek from start or relative to current position */
    if (whence != SEEK_SET && whence != SEEK_CUR)
        return -1;

    /* normalize offset to a SEEK_CUR specification */
    if (whence == SEEK_SET)
        offset -= state->x.pos;
    else if (state->seek)
        offset += state->skip;
    state->seek = 0;

    /* if within raw area while reading, just go there */
    if (state->mode == GZ_READ && state->how == COPY && state->x.pos + offset >= 0) {
        ret = LSEEK(state->fd, offset - (z_off64_t)state->x.have, SEEK_CUR);
        if (ret == -1)
            return -1;
        state->x.have = 0;
        state->eof = 0;
        state->past = 0;
        state->seek = 0;
        gz_error(state, Z_OK, NULL);
        state->strm.avail_in = 0;
        state->x.pos += offset;
        return state->x.pos;
    }

    /* calculate skip amount, rewinding if needed for back seek when reading */
    if (offset < 0) {
        if (state->mode != GZ_READ)         /* writing -- can't go backwards */
            return -1;
        offset += state->x.pos;
        if (offset < 0)                     /* before start of file! */
            return -1;
        if (PREFIX(gzrewind)(file) == -1)   /* rewind, then skip to offset */
            return -1;
    }

    /* if reading, skip what's in output buffer (one less gzgetc() check) */
    if (state->mode == GZ_READ) {
        n = GT_OFF(state->x.have) || (z_off64_t)state->x.have > offset ? (unsigned)offset : state->x.have;
        state->x.have -= n;
        state->x.next += n;
        state->x.pos += n;
        offset -= n;
    }

    /* request skip (if not zero) */
    if (offset) {
        state->seek = 1;
        state->skip = offset;
    }
    return state->x.pos + offset;
}